

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs,RK_S32 idc)

{
  RK_S32 idc_local;
  HalH264eVepuBufs *bufs_local;
  
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter %p\n","h264e_vepu_buf_set_cabac_idc",bufs);
  }
  if ((-1 < idc) && (bufs->cabac_table == (MppBuffer)0x0)) {
    mpp_buffer_get_with_tag
              (bufs->group,&bufs->cabac_table,0xbc80,"hal_h264e_vepu_v2",
               "h264e_vepu_buf_set_cabac_idc");
  }
  if (((bufs->cabac_table != (MppBuffer)0x0) && (idc != bufs->cabac_init_idc)) && (-1 < idc)) {
    vepu_write_cabac_table(bufs->cabac_table,idc);
  }
  bufs->cabac_init_idc = idc;
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_set_cabac_idc",bufs);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs, RK_S32 idc)
{
    hal_h264e_dbg_buffer("enter %p\n", bufs);

    if (idc >= 0 && !bufs->cabac_table)
        mpp_buffer_get(bufs->group, &bufs->cabac_table, H264E_CABAC_TABLE_BUF_SIZE);

    if (bufs->cabac_table && idc != bufs->cabac_init_idc && idc >= 0)
        vepu_write_cabac_table(bufs->cabac_table, idc);

    bufs->cabac_init_idc = idc;

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return MPP_OK;
}